

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

reference __thiscall
jsoncons::jsonpath::detail::
parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference param_5,
          result_options options,error_code *ec)

{
  result_options rVar1;
  path_node_type *last_00;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RCX;
  error_code *in_RDX;
  reference in_RDI;
  undefined4 in_R9D;
  pointer ptr;
  int index;
  path_node_type *ancestor;
  basic_path_node<char> *in_stack_000000f0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_000000f8;
  result_options in_stack_ffffffffffffffa4;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffc8;
  reference local_8;
  
  iVar2 = 0;
  while( true ) {
    rVar1 = in_stack_ffffffffffffffa4 & 0xffffff;
    if (in_RCX != (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   *)0x0) {
      rVar1 = CONCAT13(iVar2 < (int)in_RDI[2].field_0.half_float_,(int3)in_stack_ffffffffffffffa4);
    }
    in_stack_ffffffffffffffa4 = rVar1;
    if ((char)(in_stack_ffffffffffffffa4 >> 0x18) == '\0') break;
    in_RCX = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)basic_path_node<char>::parent((basic_path_node<char> *)in_RCX);
    iVar2 = iVar2 + 1;
  }
  if (in_RCX == (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0x0) {
    local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ::null_value(in_stack_ffffffffffffffb0);
  }
  else {
    last_00 = (path_node_type *)
              select<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const>
                        (in_stack_000000f8,in_stack_000000f0);
    if (last_00 == (path_node_type *)0x0) {
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ::null_value((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                              *)0x0);
    }
    else {
      local_8 = base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ::evaluate_tail((base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                                 *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),in_RCX,
                                (reference)CONCAT44(iVar2,in_stack_ffffffffffffffb8),last_00,in_RDI,
                                in_stack_ffffffffffffffa4,in_RDX);
    }
  }
  return local_8;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference, 
                           result_options options,
                           std::error_code& ec) const override
        {
            const path_node_type* ancestor = std::addressof(last);
            int index = 0;
            while (ancestor != nullptr && index < ancestor_depth_)
            {
                ancestor = ancestor->parent();
                ++index;
            }

            if (ancestor != nullptr)
            {
                pointer ptr = jsoncons::jsonpath::select(root, *ancestor);
                if (ptr != nullptr)
                {
                    return this->evaluate_tail(context, root, *ancestor, *ptr, options, ec);
                }
                return context.null_value();
            }
            return context.null_value();
        }